

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::ProcessCapturedSym(ByteCodeGenerator *this,Symbol *sym)

{
  code *pcVar1;
  bool bVar2;
  ScopeType SVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  Scope *pSVar4;
  FuncInfo *this_00;
  FuncInfo *this_01;
  undefined4 *puVar5;
  CharacterBuffer<char16_t> *pCVar6;
  Scope *pSVar7;
  ParseNodeFnc *pPVar8;
  Scope *scopeChild;
  ParseNode *pnodeChild;
  FuncInfo *funcChild;
  FuncInfo *funcHome;
  Symbol *sym_local;
  ByteCodeGenerator *this_local;
  
  pSVar4 = Symbol::GetScope(sym);
  this_00 = Scope::GetFunc(pSVar4);
  this_01 = FuncInfo::GetCurrentChildFunction(this_00);
  bVar2 = Symbol::NeedsSlotAlloc(sym,this,this_00);
  if ((((!bVar2) && (bVar2 = Symbol::GetIsGlobal(sym), !bVar2)) &&
      (bVar2 = Symbol::GetIsModuleImport(sym), !bVar2)) &&
     (bVar2 = Symbol::GetIsModuleExportStorage(sym), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc4c,
                       "(sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage())"
                       ,
                       "sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar4 = Symbol::GetScope(sym);
  SVar3 = Scope::GetScopeType(pSVar4);
  if (SVar3 == ScopeType_FuncExpr) {
    pSVar4 = FuncInfo::GetParamScope(this_00);
    if (pSVar4 == (Scope *)0x0) {
LAB_00b6f7ea:
      bVar2 = FuncInfo::IsBodyAndParamScopeMerged(this_00);
      if ((bVar2) && (pSVar4 = FuncInfo::GetBodyScope(this_00), pSVar4 != (Scope *)0x0)) {
        pSVar4 = FuncInfo::GetBodyScope(this_00);
        pCVar6 = Symbol::GetName(sym);
        bVar2 = Scope::HasSymbolName(pSVar4,pCVar6);
        if (bVar2) goto LAB_00b6f830;
      }
    }
    else {
      pSVar4 = FuncInfo::GetParamScope(this_00);
      pCVar6 = Symbol::GetName(sym);
      bVar2 = Scope::HasSymbolName(pSVar4,pCVar6);
      if (!bVar2) goto LAB_00b6f7ea;
LAB_00b6f830:
      pSVar4 = Symbol::GetScope(sym);
      Scope::SetIsObject(pSVar4);
    }
  }
  bVar2 = FuncInfo::IsGlobalFunction(this_00);
  if (((!bVar2) && (bVar2 = FuncInfo::GetCallsEval(this_00), !bVar2)) &&
     ((bVar2 = FuncInfo::GetChildCallsEval(this_00), !bVar2 && (this_01 != (FuncInfo *)0x0)))) {
    pSVar4 = Symbol::GetScope(sym);
    pSVar7 = FuncInfo::GetBodyScope(this_00);
    if ((pSVar4 == pSVar7) && (bVar2 = IsInDebugMode(this), !bVar2)) {
      sourceContextId =
           Js::FunctionProxy::GetSourceContextId(&this_00->byteCodeFunction->super_FunctionProxy);
      functionId = Js::FunctionProxy::GetLocalFunctionId
                             (&this_00->byteCodeFunction->super_FunctionProxy);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eafdf0,DelayCapturePhase,sourceContextId,functionId);
      if (!bVar2) goto LAB_00b6f8f7;
    }
  }
  Symbol::SetIsCommittedToSlot(sym);
LAB_00b6f8f7:
  bVar2 = Symbol::GetIsCommittedToSlot(sym);
  if (!bVar2) {
    if (this_01 == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xc6b,"(funcChild)","funcChild");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pPVar8 = this_01->root;
    if ((pPVar8 == (ParseNodeFnc *)0x0) || ((pPVar8->super_ParseNode).nop != knopFncDecl)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xc6e,"(pnodeChild && pnodeChild->nop == knopFncDecl)",
                         "pnodeChild && pnodeChild->nop == knopFncDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pPVar8 = ParseNode::AsParseNodeFnc(&pPVar8->super_ParseNode);
    bVar2 = ParseNodeFnc::IsDeclaration(pPVar8);
    if (bVar2) {
      pSVar4 = FuncInfo::GetCurrentChildScope(this_00);
      pSVar7 = Symbol::GetScope(sym);
      if ((pSVar4 == pSVar7) ||
         (SVar3 = Scope::GetScopeType(pSVar4), SVar3 == ScopeType_FunctionBody)) {
        Symbol::SetIsCommittedToSlot(sym);
        return;
      }
    }
    FuncInfo::AddCapturedSym(this_01,sym);
  }
  return;
}

Assistant:

void ByteCodeGenerator::ProcessCapturedSym(Symbol *sym)
{
    // The symbol's home function will tell us which child function we're currently processing.
    // This is the one that captures the symbol, from the declaring function's perspective.
    // So based on that information, note either that, (a.) the symbol is committed to the heap from its
    // inception, (b.) the symbol must be committed when the capturing function is instantiated.

    FuncInfo *funcHome = sym->GetScope()->GetFunc();
    FuncInfo *funcChild = funcHome->GetCurrentChildFunction();

    Assert(sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage());

    if (sym->GetScope()->GetScopeType() == ScopeType_FuncExpr)
    {
        if ((funcHome->GetParamScope() && Scope::HasSymbolName(funcHome->GetParamScope(), sym->GetName())) ||
            (funcHome->IsBodyAndParamScopeMerged() && funcHome->GetBodyScope() && Scope::HasSymbolName(funcHome->GetBodyScope(), sym->GetName())))
        {
            // Make sure the function expression scope gets instantiated, since we can't merge the name symbol into another scope.
            // Make it an object, since that's the only case the code gen can currently handle.
            sym->GetScope()->SetIsObject();
        }
    }

    // If this is not a local property, or not all its references can be tracked, or
    // it's not scoped to the function, or we're in debug mode, disable the delayed capture optimization.
    if (funcHome->IsGlobalFunction() ||
        funcHome->GetCallsEval() ||
        funcHome->GetChildCallsEval() ||
        funcChild == nullptr ||
        sym->GetScope() != funcHome->GetBodyScope() ||
        this->IsInDebugMode() ||
        PHASE_OFF(Js::DelayCapturePhase, funcHome->byteCodeFunction))
    {
        sym->SetIsCommittedToSlot();
    }

    if (sym->GetIsCommittedToSlot())
    {
        return;
    }

    AnalysisAssert(funcChild);
    ParseNode *pnodeChild = funcChild->root;

    Assert(pnodeChild && pnodeChild->nop == knopFncDecl);

    if (pnodeChild->AsParseNodeFnc()->IsDeclaration())
    {
        // The capturing function is a declaration but may still be limited to an inner scope.
        Scope *scopeChild = funcHome->GetCurrentChildScope();
        if (scopeChild == sym->GetScope() || scopeChild->GetScopeType() == ScopeType_FunctionBody)
        {
            // The symbol is captured on entry to the scope in which it's declared.
            // (Check the scope type separately so that we get the special parameter list and
            // named function expression cases as well.)
            sym->SetIsCommittedToSlot();
            return;
        }
    }

    // There is a chance we can limit the region in which the symbol lives on the heap.
    // Note which function captures the symbol.
    funcChild->AddCapturedSym(sym);
}